

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RevoluteJoint.cpp
# Opt level: O3

RevoluteJoint * __thiscall
iDynTree::RevoluteJoint::getRestTransform(RevoluteJoint *this,LinkIndex p_linkA,LinkIndex p_linkB)

{
  if (*(long *)(p_linkA + 0x20) == p_linkB) {
    iDynTree::Transform::Transform((Transform *)this,(Transform *)(p_linkA + 0x30));
  }
  else {
    iDynTree::Transform::inverse();
  }
  return this;
}

Assistant:

Transform RevoluteJoint::getRestTransform(const LinkIndex p_linkA, const LinkIndex p_linkB) const
{
    if( p_linkA == link1 )
    {
        assert(p_linkB == link2);
        return link1_X_link2_at_rest;
    }
    else
    {
        assert(p_linkA == link2);
        assert(p_linkB == link1);
        return link1_X_link2_at_rest.inverse();
    }
}